

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

void __thiscall
vkt::SpirVAssembly::ConvertCase::ConvertCase
          (ConvertCase *this,IntegerType from,IntegerType to,deInt64 number)

{
  ComputeTestFeatures CVar1;
  mapped_type *pmVar2;
  IntegerType type;
  BufferSp BVar3;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  key_type local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  allocator<char> local_71;
  key_type local_70;
  string local_50;
  deInt64 local_20;
  deInt64 number_local;
  IntegerType to_local;
  IntegerType from_local;
  ConvertCase *this_local;
  
  this->m_fromType = from;
  this->m_toType = to;
  local_20 = number;
  number_local._0_4_ = to;
  number_local._4_4_ = from;
  _to_local = this;
  CVar1 = getConversionUsedFeatures(from,to);
  this->m_features = CVar1;
  getTestName_abi_cxx11_
            (&this->m_name,(SpirVAssembly *)(ulong)number_local._4_4_,(IntegerType)number_local,to);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_asmTypes);
  getBuffer((SpirVAssembly *)&this->m_inputBuffer,number_local._4_4_,local_20);
  BVar3 = getBuffer((SpirVAssembly *)&this->m_outputBuffer,(IntegerType)number_local,local_20);
  getAsmTypeDeclaration_abi_cxx11_
            (&local_50,(SpirVAssembly *)(ulong)number_local._4_4_,(IntegerType)BVar3.m_state);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"inputType",&local_71);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_asmTypes,&local_70);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  getAsmTypeDeclaration_abi_cxx11_(&local_98,(SpirVAssembly *)(ulong)(IntegerType)number_local,type)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"outputType",&local_b9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_asmTypes,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  if (this->m_features == COMPUTE_TEST_USES_INT16) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"int_capabilities",&local_e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_asmTypes,&local_e0);
    std::__cxx11::string::operator=((string *)pmVar2,"OpCapability Int16\n");
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  else if (this->m_features == COMPUTE_TEST_USES_INT64) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"int_capabilities",&local_109);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_asmTypes,&local_108);
    std::__cxx11::string::operator=((string *)pmVar2,"OpCapability Int64\n");
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  else if (this->m_features == COMPUTE_TEST_USES_INT16_INT64) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"OpCapability Int16\n",&local_151);
    std::operator+(&local_130,&local_150,"OpCapability Int64\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"int_capabilities",&local_179);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_asmTypes,&local_178);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  return;
}

Assistant:

ConvertCase (IntegerType from, IntegerType to, deInt64 number)
	: m_fromType		(from)
	, m_toType			(to)
	, m_features		(getConversionUsedFeatures(from, to))
	, m_name			(getTestName(from, to))
	, m_inputBuffer		(getBuffer(from, number))
	, m_outputBuffer	(getBuffer(to, number))
	{
		m_asmTypes["inputType"]		= getAsmTypeDeclaration(from);
		m_asmTypes["outputType"]	= getAsmTypeDeclaration(to);

		if (m_features == COMPUTE_TEST_USES_INT16)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int16\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT64)
		{
			m_asmTypes["int_capabilities"] = "OpCapability Int64\n";
		}
		else if (m_features == COMPUTE_TEST_USES_INT16_INT64)
		{
			m_asmTypes["int_capabilities"] = string("OpCapability Int16\n") +
													"OpCapability Int64\n";
		}
		else
		{
			DE_ASSERT(false);
		}
	}